

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sub.c
# Opt level: O3

_Bool sub0_matches(sub0_ctx *ctx,uint8_t *body,size_t len)

{
  size_t __n;
  int iVar1;
  void *item;
  
  item = nni_list_first(&ctx->topics);
  do {
    if (item == (void *)0x0) {
      return false;
    }
    __n = *(size_t *)((long)item + 0x10);
    if (__n <= len) {
      if (__n == 0) {
        return true;
      }
      iVar1 = bcmp(*(void **)((long)item + 0x18),body,__n);
      if (iVar1 == 0) {
        return true;
      }
    }
    item = nni_list_next(&ctx->topics,item);
  } while( true );
}

Assistant:

static bool
sub0_matches(sub0_ctx *ctx, uint8_t *body, size_t len)
{
	sub0_topic *topic;

	// This is a naive and trivial matcher.  Replace with a real
	// patricia trie later.
	NNI_LIST_FOREACH (&ctx->topics, topic) {
		if (len < topic->len) {
			continue;
		}
		if ((topic->len == 0) ||
		    (memcmp(topic->buf, body, topic->len) == 0)) {
			return (true);
		}
	}
	return (false);
}